

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

longdouble * __thiscall
TPZFMatrix<long_double>::operator()(TPZFMatrix<long_double> *this,int64_t row)

{
  int64_t row_local;
  TPZFMatrix<long_double> *this_local;
  
  return this->fElem + row;
}

Assistant:

inline TVar &TPZFMatrix<TVar>::operator()(const int64_t row) {
#ifdef PZDEBUG
    if(row >=  this->Rows() || row<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+row);
}